

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

void addtoclib(lua_State *L,char *path,void *plib)

{
  lua_Integer lVar1;
  
  lua_rawgetp(L,-0xf4628,&CLIBS);
  lua_pushlightuserdata(L,plib);
  lua_pushvalue(L,-1);
  lua_setfield(L,-3,path);
  lVar1 = luaL_len(L,-2);
  lua_rawseti(L,-2,lVar1 + 1);
  lua_settop(L,-2);
  return;
}

Assistant:

static void addtoclib (lua_State *L, const char *path, void *plib) {
  lua_rawgetp(L, LUA_REGISTRYINDEX, &CLIBS);
  lua_pushlightuserdata(L, plib);
  lua_pushvalue(L, -1);
  lua_setfield(L, -3, path);  /* CLIBS[path] = plib */
  lua_rawseti(L, -2, luaL_len(L, -2) + 1);  /* CLIBS[#CLIBS + 1] = plib */
  lua_pop(L, 1);  /* pop CLIBS table */
}